

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMinkowskiPenetrationDepthSolver.cpp
# Opt level: O0

bool __thiscall
btMinkowskiPenetrationDepthSolver::calcPenDepth
          (btMinkowskiPenetrationDepthSolver *this,btVoronoiSimplexSolver *simplexSolver,
          btConvexShape *convexA,btConvexShape *convexB,btTransform *transA,btTransform *transB,
          btVector3 *v,btVector3 *pa,btVector3 *pb,btIDebugDraw *debugDraw)

{
  bool bVar1;
  btVector3 *pbVar2;
  btScalar *pbVar3;
  long *in_RCX;
  long *in_RDX;
  btTransform *in_R8;
  btTransform *in_R9;
  btScalar bVar4;
  btScalar bVar5;
  btVector3 bVar6;
  btScalar *in_stack_00000008;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  btScalar penetration_relaxation;
  btScalar correctedMinNorm;
  btIntermediateResult res;
  btTransform displacedTrans;
  btVector3 newOrg;
  ClosestPointInput input;
  btVector3 offset;
  btScalar offsetDist;
  btGjkPairDetector gjkdet;
  btScalar extraSeparation;
  btScalar delta;
  btVector3 norm_3;
  btVector3 norm_2;
  int i_2;
  int numPDB;
  btVector3 norm_1;
  int i_1;
  int numPDA;
  btVector3 norm;
  int numSampleDirections;
  int i;
  btVector3 seperatingAxisInBBatch [62];
  btVector3 seperatingAxisInABatch [62];
  btVector3 supportVerticesBBatch [62];
  btVector3 supportVerticesABatch [62];
  btVector3 w;
  btVector3 qWorld;
  btVector3 pWorld;
  btVector3 qInB;
  btVector3 pInA;
  btVector3 seperatingAxisInB;
  btVector3 seperatingAxisInA;
  btVector3 minB;
  btVector3 minA;
  btVector3 minNorm;
  btScalar minProj;
  bool check2d;
  undefined1 in_stack_ffffffffffffeaf8 [16];
  undefined1 in_stack_ffffffffffffeb08 [16];
  undefined1 in_stack_ffffffffffffeb28 [16];
  btConvexShape *in_stack_ffffffffffffeb38;
  btConvexPenetrationDepthSolver *local_14a8;
  undefined1 in_stack_ffffffffffffeb68 [16];
  undefined1 in_stack_ffffffffffffeb78 [16];
  btScalar local_1458;
  btScalar bStack_1454;
  btVector3 *local_1418;
  btVector3 *local_1400;
  btVector3 *local_13e8;
  btVector3 *local_13d0;
  bool local_13c1;
  btScalar local_13a0;
  float local_139c;
  btVector3 local_1398 [2];
  undefined8 local_1370;
  undefined8 local_1368;
  float local_1360;
  byte local_135c;
  btTransform local_1358;
  btVector3 local_1318 [9];
  undefined4 local_1288;
  btScalar local_1274;
  btScalar bStack_1270;
  undefined8 local_126c;
  float local_1264;
  btGjkPairDetector local_1260;
  undefined4 local_11f8;
  btScalar local_11f4;
  btVector3 local_11f0;
  btScalar local_11e0;
  btVector3 local_11dc;
  btScalar local_11cc;
  btScalar local_11c8 [2];
  btScalar local_11c0 [2];
  btScalar local_11b8 [2];
  btScalar local_11b0 [2];
  btScalar local_11a8 [2];
  btScalar abStack_11a0 [2];
  btVector3 local_1198;
  undefined8 local_1188;
  undefined8 local_1180;
  undefined8 local_1178;
  undefined8 local_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  btScalar local_1158 [2];
  btScalar abStack_1150 [2];
  btVector3 local_1148;
  int local_1130;
  int local_112c;
  undefined8 local_1128;
  undefined8 local_1120;
  undefined8 local_1118;
  undefined8 local_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  btScalar local_10f8 [2];
  btScalar abStack_10f0 [2];
  btVector3 local_10e8;
  int local_10d0;
  int local_10cc;
  undefined8 local_10c8;
  undefined8 local_10c0;
  undefined8 local_10b8;
  undefined8 local_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  int local_1080;
  int local_107c;
  btVector3 local_1078 [62];
  btVector3 local_c98 [62];
  btVector3 local_8b8 [62];
  btVector3 local_4d8 [62];
  btVector3 local_f8;
  btVector3 local_e8;
  btVector3 local_d8;
  btVector3 local_c8;
  btVector3 local_b8;
  btVector3 local_a8;
  btVector3 local_98;
  btVector3 local_7c;
  btVector3 local_6c;
  btScalar local_5c;
  btScalar local_58;
  btScalar local_54;
  btVector3 local_50;
  btScalar local_40;
  bool local_39;
  btTransform *local_38;
  btTransform *local_30;
  long *local_28;
  long *local_20;
  byte local_1;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  bVar1 = btCollisionShape::isConvex2d((btCollisionShape *)0x1eac44);
  local_13c1 = false;
  if (bVar1) {
    local_13c1 = btCollisionShape::isConvex2d((btCollisionShape *)0x1eac63);
  }
  local_39 = local_13c1;
  local_40 = 1e+18;
  local_54 = 0.0;
  local_58 = 0.0;
  local_5c = 0.0;
  btVector3::btVector3(&local_50,&local_54,&local_58,&local_5c);
  btVector3::btVector3(&local_6c);
  btVector3::btVector3(&local_7c);
  btVector3::btVector3(&local_98);
  btVector3::btVector3(&local_a8);
  btVector3::btVector3(&local_b8);
  btVector3::btVector3(&local_c8);
  btVector3::btVector3(&local_d8);
  btVector3::btVector3(&local_e8);
  btVector3::btVector3(&local_f8);
  local_13d0 = local_4d8;
  do {
    btVector3::btVector3(local_13d0);
    local_13d0 = local_13d0 + 1;
  } while (local_13d0 != &local_f8);
  local_13e8 = local_8b8;
  do {
    btVector3::btVector3(local_13e8);
    local_13e8 = local_13e8 + 1;
  } while (local_13e8 != local_4d8);
  local_1400 = local_c98;
  do {
    btVector3::btVector3(local_1400);
    local_1400 = local_1400 + 1;
  } while (local_1400 != local_8b8);
  local_1418 = local_1078;
  do {
    btVector3::btVector3(local_1418);
    local_1418 = local_1418 + 1;
  } while (local_1418 != local_c98);
  local_1080 = 0x2a;
  for (local_107c = 0; local_107c < local_1080; local_107c = local_107c + 1) {
    pbVar2 = getPenetrationDirections();
    local_1098 = *(undefined8 *)pbVar2[local_107c].m_floats;
    uStack_1090 = *(undefined8 *)(pbVar2[local_107c].m_floats + 2);
    bVar6 = operator-(in_stack_ffffffffffffeaf8._8_8_);
    local_10b8 = bVar6.m_floats._0_8_;
    local_10b0 = bVar6.m_floats._8_8_;
    btTransform::getBasis(local_30);
    bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
    local_10a8 = bVar6.m_floats._0_8_;
    uStack_10a0 = bVar6.m_floats._8_8_;
    *(undefined8 *)local_c98[local_107c].m_floats = local_10a8;
    *(undefined8 *)(local_c98[local_107c].m_floats + 2) = uStack_10a0;
    btTransform::getBasis(local_38);
    bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
    local_10c8 = bVar6.m_floats._0_8_;
    local_10c0 = bVar6.m_floats._8_8_;
    *(undefined8 *)local_1078[local_107c].m_floats = local_10c8;
    *(undefined8 *)(local_1078[local_107c].m_floats + 2) = local_10c0;
  }
  local_10cc = (**(code **)(*local_20 + 0xa8))();
  if (local_10cc != 0) {
    for (local_10d0 = 0; local_10d0 < local_10cc; local_10d0 = local_10d0 + 1) {
      btVector3::btVector3(&local_10e8);
      (**(code **)(*local_20 + 0xb0))(local_20,local_10d0,&local_10e8);
      btTransform::getBasis(local_30);
      bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
      local_10f8 = bVar6.m_floats._0_8_;
      abStack_10f0 = bVar6.m_floats._8_8_;
      local_10e8.m_floats._0_8_ = local_10f8;
      local_10e8.m_floats._8_8_ = abStack_10f0;
      pbVar2 = getPenetrationDirections();
      *(undefined8 *)pbVar2[local_1080].m_floats = local_10e8.m_floats._0_8_;
      *(undefined8 *)(pbVar2[local_1080].m_floats + 2) = local_10e8.m_floats._8_8_;
      bVar6 = operator-(in_stack_ffffffffffffeaf8._8_8_);
      local_1118 = bVar6.m_floats._0_8_;
      local_1110 = bVar6.m_floats._8_8_;
      btTransform::getBasis(local_30);
      bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
      local_1108 = bVar6.m_floats._0_8_;
      uStack_1100 = bVar6.m_floats._8_8_;
      *(undefined8 *)local_c98[local_1080].m_floats = local_1108;
      *(undefined8 *)(local_c98[local_1080].m_floats + 2) = uStack_1100;
      btTransform::getBasis(local_38);
      bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
      local_1128 = bVar6.m_floats._0_8_;
      local_1120 = bVar6.m_floats._8_8_;
      *(undefined8 *)local_1078[local_1080].m_floats = local_1128;
      *(undefined8 *)(local_1078[local_1080].m_floats + 2) = local_1120;
      local_1080 = local_1080 + 1;
    }
  }
  local_112c = (**(code **)(*local_28 + 0xa8))();
  if (local_112c != 0) {
    for (local_1130 = 0; local_1130 < local_112c; local_1130 = local_1130 + 1) {
      btVector3::btVector3(&local_1148);
      (**(code **)(*local_28 + 0xb0))(local_28,local_1130,&local_1148);
      btTransform::getBasis(local_38);
      bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
      local_1158 = bVar6.m_floats._0_8_;
      abStack_1150 = bVar6.m_floats._8_8_;
      local_1148.m_floats._0_8_ = local_1158;
      local_1148.m_floats._8_8_ = abStack_1150;
      pbVar2 = getPenetrationDirections();
      *(undefined8 *)pbVar2[local_1080].m_floats = local_1148.m_floats._0_8_;
      *(undefined8 *)(pbVar2[local_1080].m_floats + 2) = local_1148.m_floats._8_8_;
      bVar6 = operator-(in_stack_ffffffffffffeaf8._8_8_);
      local_1178 = bVar6.m_floats._0_8_;
      local_1170 = bVar6.m_floats._8_8_;
      btTransform::getBasis(local_30);
      bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
      local_1168 = bVar6.m_floats._0_8_;
      uStack_1160 = bVar6.m_floats._8_8_;
      *(undefined8 *)local_c98[local_1080].m_floats = local_1168;
      *(undefined8 *)(local_c98[local_1080].m_floats + 2) = uStack_1160;
      btTransform::getBasis(local_38);
      bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
      local_1188 = bVar6.m_floats._0_8_;
      local_1180 = bVar6.m_floats._8_8_;
      *(undefined8 *)local_1078[local_1080].m_floats = local_1188;
      *(undefined8 *)(local_1078[local_1080].m_floats + 2) = local_1180;
      local_1080 = local_1080 + 1;
    }
  }
  (**(code **)(*local_20 + 0x98))(local_20,local_c98,local_4d8,local_1080);
  (**(code **)(*local_28 + 0x98))(local_28,local_1078,local_8b8,local_1080);
  for (local_107c = 0; local_107c < local_1080; local_107c = local_107c + 1) {
    pbVar2 = getPenetrationDirections();
    local_1198.m_floats._0_8_ = *(undefined8 *)pbVar2[local_107c].m_floats;
    local_1198.m_floats._8_8_ = *(undefined8 *)(pbVar2[local_107c].m_floats + 2);
    if ((local_39 & 1U) != 0) {
      pbVar3 = btVector3::operator_cast_to_float_(&local_1198);
      pbVar3[2] = 0.0;
    }
    bVar4 = btVector3::length2((btVector3 *)0x1eb42d);
    if (0.01 < bVar4) {
      local_98.m_floats._0_8_ = *(undefined8 *)local_c98[local_107c].m_floats;
      local_98.m_floats._8_8_ = *(undefined8 *)(local_c98[local_107c].m_floats + 2);
      local_a8.m_floats._0_8_ = *(undefined8 *)local_1078[local_107c].m_floats;
      local_a8.m_floats._8_8_ = *(undefined8 *)(local_1078[local_107c].m_floats + 2);
      local_b8.m_floats._0_8_ = *(undefined8 *)local_4d8[local_107c].m_floats;
      local_b8.m_floats._8_8_ = *(undefined8 *)(local_4d8[local_107c].m_floats + 2);
      local_c8.m_floats._0_8_ = *(undefined8 *)local_8b8[local_107c].m_floats;
      local_c8.m_floats._8_8_ = *(undefined8 *)(local_8b8[local_107c].m_floats + 2);
      bVar6 = btTransform::operator()
                        (in_stack_ffffffffffffeb28._8_8_,in_stack_ffffffffffffeb28._0_8_);
      local_11a8 = bVar6.m_floats._0_8_;
      abStack_11a0 = bVar6.m_floats._8_8_;
      local_d8.m_floats._0_8_ = local_11a8;
      local_d8.m_floats._8_8_ = abStack_11a0;
      bVar6 = btTransform::operator()
                        (in_stack_ffffffffffffeb28._8_8_,in_stack_ffffffffffffeb28._0_8_);
      local_11b8 = bVar6.m_floats._0_8_;
      local_11b0 = bVar6.m_floats._8_8_;
      local_e8.m_floats._0_8_ = local_11b8;
      local_e8.m_floats._8_8_ = local_11b0;
      if ((local_39 & 1U) != 0) {
        pbVar3 = btVector3::operator_cast_to_float_(&local_d8);
        pbVar3[2] = 0.0;
        pbVar3 = btVector3::operator_cast_to_float_(&local_e8);
        pbVar3[2] = 0.0;
      }
      bVar6 = operator-(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
      local_11c8 = bVar6.m_floats._0_8_;
      local_11c0 = bVar6.m_floats._8_8_;
      local_f8.m_floats._0_8_ = local_11c8;
      local_f8.m_floats._8_8_ = local_11c0;
      local_11cc = btVector3::dot(&local_1198,&local_f8);
      if (local_11cc < local_40) {
        local_50.m_floats[0] = local_1198.m_floats[0];
        local_50.m_floats[1] = local_1198.m_floats[1];
        local_50.m_floats[2] = local_1198.m_floats[2];
        local_50.m_floats[3] = local_1198.m_floats[3];
        local_6c.m_floats[0] = local_d8.m_floats[0];
        local_6c.m_floats[1] = local_d8.m_floats[1];
        local_6c.m_floats[2] = local_d8.m_floats[2];
        local_6c.m_floats[3] = local_d8.m_floats[3];
        local_7c.m_floats[0] = local_e8.m_floats[0];
        local_7c.m_floats[1] = local_e8.m_floats[1];
        local_7c.m_floats[2] = local_e8.m_floats[2];
        local_7c.m_floats[3] = local_e8.m_floats[3];
        local_40 = local_11cc;
      }
    }
  }
  local_11e0 = btConvexShape::getMarginNonVirtual(in_stack_ffffffffffffeb38);
  bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
  local_11dc.m_floats._0_8_ = bVar6.m_floats._0_8_;
  local_11dc.m_floats._8_8_ = bVar6.m_floats._8_8_;
  btVector3::operator+=(&local_6c,&local_11dc);
  local_11f4 = btConvexShape::getMarginNonVirtual(in_stack_ffffffffffffeb38);
  bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
  local_11f0.m_floats._0_8_ = bVar6.m_floats._0_8_;
  local_11f0.m_floats._8_8_ = bVar6.m_floats._8_8_;
  btVector3::operator-=(&local_7c,&local_11f0);
  if (0.0 <= local_40) {
    local_11f8 = 0x3f000000;
    bVar4 = btConvexShape::getMarginNonVirtual(in_stack_ffffffffffffeb38);
    bVar5 = btConvexShape::getMarginNonVirtual(in_stack_ffffffffffffeb38);
    local_40 = local_40 + bVar4 + bVar5 + 0.5;
    btGjkPairDetector::btGjkPairDetector
              (in_stack_ffffffffffffeb78._8_8_,in_stack_ffffffffffffeb78._0_8_,
               in_stack_ffffffffffffeb68._8_8_,in_stack_ffffffffffffeb68._0_8_,local_14a8);
    local_1264 = local_40;
    bVar6 = ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
    local_126c = bVar6.m_floats._8_8_;
    local_1458 = bVar6.m_floats[0];
    bStack_1454 = bVar6.m_floats[1];
    local_1274 = local_1458;
    bStack_1270 = bStack_1454;
    btDiscreteCollisionDetectorInterface::ClosestPointInput::ClosestPointInput
              (in_stack_ffffffffffffeaf8._8_8_);
    btTransform::getOrigin(local_30);
    bVar6 = operator+(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
    local_1318[0].m_floats._8_8_ = bVar6.m_floats._8_8_;
    local_1318[0].m_floats[0] = bVar6.m_floats[0];
    local_1318[0].m_floats[1] = bVar6.m_floats[1];
    btTransform::btTransform(in_stack_ffffffffffffeaf8._8_8_,in_stack_ffffffffffffeaf8._0_8_);
    btTransform::setOrigin(&local_1358,local_1318);
    btTransform::operator=(in_stack_ffffffffffffeaf8._8_8_,in_stack_ffffffffffffeaf8._0_8_);
    btTransform::operator=(in_stack_ffffffffffffeaf8._8_8_,in_stack_ffffffffffffeaf8._0_8_);
    local_1288 = 0x5d5e0b6b;
    calcPenDepth::btIntermediateResult::btIntermediateResult(in_stack_ffffffffffffeb08._8_8_);
    bVar6 = operator-(in_stack_ffffffffffffeaf8._8_8_);
    local_1398[0].m_floats._8_8_ = bVar6.m_floats._8_8_;
    local_1398[0].m_floats._0_8_ = bVar6.m_floats._0_8_;
    btGjkPairDetector::setCachedSeperatingAxis(&local_1260,local_1398);
    btGjkPairDetector::getClosestPoints
              (in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_,
               in_stack_ffffffffffffeaf8._8_8_,in_stack_ffffffffffffeaf8._0_8_,false);
    local_139c = local_40 - local_1360;
    local_13a0 = 1.0;
    btVector3::operator*=(&local_50,&local_13a0);
    if ((local_135c & 1) != 0) {
      ::operator*(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
      bVar6 = operator-(in_stack_ffffffffffffeb08._8_8_,in_stack_ffffffffffffeb08._0_8_);
      *in_stack_00000010 = bVar6.m_floats._0_8_;
      in_stack_00000010[1] = bVar6.m_floats._8_8_;
      *in_stack_00000018 = local_1370;
      in_stack_00000018[1] = local_1368;
      *(undefined8 *)in_stack_00000008 = local_50.m_floats._0_8_;
      *(undefined8 *)(in_stack_00000008 + 2) = local_50.m_floats._8_8_;
    }
    local_1 = local_135c & 1;
    calcPenDepth::btIntermediateResult::~btIntermediateResult((btIntermediateResult *)0x1ebb06);
    btGjkPairDetector::~btGjkPairDetector((btGjkPairDetector *)0x1ebb13);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool btMinkowskiPenetrationDepthSolver::calcPenDepth(btSimplexSolverInterface& simplexSolver,
												   const btConvexShape* convexA,const btConvexShape* convexB,
												   const btTransform& transA,const btTransform& transB,
												   btVector3& v, btVector3& pa, btVector3& pb,
												   class btIDebugDraw* debugDraw
												   )
{

	(void)v;
	
	bool check2d= convexA->isConvex2d() && convexB->isConvex2d();

	struct btIntermediateResult : public btDiscreteCollisionDetectorInterface::Result
	{

		btIntermediateResult():m_hasResult(false)
		{
		}
		
		btVector3 m_normalOnBInWorld;
		btVector3 m_pointInWorld;
		btScalar m_depth;
		bool	m_hasResult;

		virtual void setShapeIdentifiersA(int partId0,int index0)
		{
			(void)partId0;
			(void)index0;
		}
		virtual void setShapeIdentifiersB(int partId1,int index1)
		{
			(void)partId1;
			(void)index1;
		}
		void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar depth)
		{
			m_normalOnBInWorld = normalOnBInWorld;
			m_pointInWorld = pointInWorld;
			m_depth = depth;
			m_hasResult = true;
		}
	};

	//just take fixed number of orientation, and sample the penetration depth in that direction
	btScalar minProj = btScalar(BT_LARGE_FLOAT);
	btVector3 minNorm(btScalar(0.), btScalar(0.), btScalar(0.));
	btVector3 minA,minB;
	btVector3 seperatingAxisInA,seperatingAxisInB;
	btVector3 pInA,qInB,pWorld,qWorld,w;

#ifndef __SPU__
#define USE_BATCHED_SUPPORT 1
#endif
#ifdef USE_BATCHED_SUPPORT

	btVector3	supportVerticesABatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	btVector3	supportVerticesBBatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	btVector3	seperatingAxisInABatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	btVector3	seperatingAxisInBBatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	int i;

	int numSampleDirections = NUM_UNITSPHERE_POINTS;

	for (i=0;i<numSampleDirections;i++)
	{
		btVector3 norm = getPenetrationDirections()[i];
		seperatingAxisInABatch[i] =  (-norm) * transA.getBasis() ;
		seperatingAxisInBBatch[i] =  norm   * transB.getBasis() ;
	}

	{
		int numPDA = convexA->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				convexA->getPreferredPenetrationDirection(i,norm);
				norm  = transA.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				seperatingAxisInABatch[numSampleDirections] = (-norm) * transA.getBasis();
				seperatingAxisInBBatch[numSampleDirections] = norm * transB.getBasis();
				numSampleDirections++;
			}
		}
	}

	{
		int numPDB = convexB->getNumPreferredPenetrationDirections();
		if (numPDB)
		{
			for (int i=0;i<numPDB;i++)
			{
				btVector3 norm;
				convexB->getPreferredPenetrationDirection(i,norm);
				norm  = transB.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				seperatingAxisInABatch[numSampleDirections] = (-norm) * transA.getBasis();
				seperatingAxisInBBatch[numSampleDirections] = norm * transB.getBasis();
				numSampleDirections++;
			}
		}
	}




	convexA->batchedUnitVectorGetSupportingVertexWithoutMargin(seperatingAxisInABatch,supportVerticesABatch,numSampleDirections);
	convexB->batchedUnitVectorGetSupportingVertexWithoutMargin(seperatingAxisInBBatch,supportVerticesBBatch,numSampleDirections);

	for (i=0;i<numSampleDirections;i++)
	{
		btVector3 norm = getPenetrationDirections()[i];
		if (check2d)
		{
			norm[2] = 0.f;
		}
		if (norm.length2()>0.01)
		{

			seperatingAxisInA = seperatingAxisInABatch[i];
			seperatingAxisInB = seperatingAxisInBBatch[i];

			pInA = supportVerticesABatch[i];
			qInB = supportVerticesBBatch[i];

			pWorld = transA(pInA);	
			qWorld = transB(qInB);
			if (check2d)
			{
				pWorld[2] = 0.f;
				qWorld[2] = 0.f;
			}

			w	= qWorld - pWorld;
			btScalar delta = norm.dot(w);
			//find smallest delta
			if (delta < minProj)
			{
				minProj = delta;
				minNorm = norm;
				minA = pWorld;
				minB = qWorld;
			}
		}
	}	
#else

	int numSampleDirections = NUM_UNITSPHERE_POINTS;

#ifndef __SPU__
	{
		int numPDA = convexA->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				convexA->getPreferredPenetrationDirection(i,norm);
				norm  = transA.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}

	{
		int numPDB = convexB->getNumPreferredPenetrationDirections();
		if (numPDB)
		{
			for (int i=0;i<numPDB;i++)
			{
				btVector3 norm;
				convexB->getPreferredPenetrationDirection(i,norm);
				norm  = transB.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}
#endif // __SPU__

	for (int i=0;i<numSampleDirections;i++)
	{
		const btVector3& norm = getPenetrationDirections()[i];
		seperatingAxisInA = (-norm)* transA.getBasis();
		seperatingAxisInB = norm* transB.getBasis();
		pInA = convexA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
		qInB = convexB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);
		pWorld = transA(pInA);	
		qWorld = transB(qInB);
		w	= qWorld - pWorld;
		btScalar delta = norm.dot(w);
		//find smallest delta
		if (delta < minProj)
		{
			minProj = delta;
			minNorm = norm;
			minA = pWorld;
			minB = qWorld;
		}
	}
#endif //USE_BATCHED_SUPPORT

	//add the margins

	minA += minNorm*convexA->getMarginNonVirtual();
	minB -= minNorm*convexB->getMarginNonVirtual();
	//no penetration
	if (minProj < btScalar(0.))
		return false;

	btScalar extraSeparation = 0.5f;///scale dependent
	minProj += extraSeparation+(convexA->getMarginNonVirtual() + convexB->getMarginNonVirtual());





//#define DEBUG_DRAW 1
#ifdef DEBUG_DRAW
	if (debugDraw)
	{
		btVector3 color(0,1,0);
		debugDraw->drawLine(minA,minB,color);
		color = btVector3 (1,1,1);
		btVector3 vec = minB-minA;
		btScalar prj2 = minNorm.dot(vec);
		debugDraw->drawLine(minA,minA+(minNorm*minProj),color);

	}
#endif //DEBUG_DRAW

	

	btGjkPairDetector gjkdet(convexA,convexB,&simplexSolver,0);

	btScalar offsetDist = minProj;
	btVector3 offset = minNorm * offsetDist;
	


	btGjkPairDetector::ClosestPointInput input;
		
	btVector3 newOrg = transA.getOrigin() + offset;

	btTransform displacedTrans = transA;
	displacedTrans.setOrigin(newOrg);

	input.m_transformA = displacedTrans;
	input.m_transformB = transB;
	input.m_maximumDistanceSquared = btScalar(BT_LARGE_FLOAT);//minProj;
	
	btIntermediateResult res;
	gjkdet.setCachedSeperatingAxis(-minNorm);
	gjkdet.getClosestPoints(input,res,debugDraw);

	btScalar correctedMinNorm = minProj - res.m_depth;


	//the penetration depth is over-estimated, relax it
	btScalar penetration_relaxation= btScalar(1.);
	minNorm*=penetration_relaxation;
	

	if (res.m_hasResult)
	{

		pa = res.m_pointInWorld - minNorm * correctedMinNorm;
		pb = res.m_pointInWorld;
		v = minNorm;
		
#ifdef DEBUG_DRAW
		if (debugDraw)
		{
			btVector3 color(1,0,0);
			debugDraw->drawLine(pa,pb,color);
		}
#endif//DEBUG_DRAW


	}
	return res.m_hasResult;
}